

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O1

nni_sp_tran * nni_sp_tran_find(char *url)

{
  char *__s;
  bool bVar1;
  int iVar2;
  nni_sp_tran *item;
  size_t __n;
  nni_sp_tran *pnVar3;
  nni_sp_tran *unaff_R15;
  
  item = (nni_sp_tran *)nni_list_first(&sp_tran_list);
  do {
    if (item == (nni_sp_tran *)0x0) {
      return (nni_sp_tran *)0x0;
    }
    __s = item->tran_scheme;
    __n = strlen(__s);
    iVar2 = strncmp(url,__s,__n);
    if (iVar2 == 0) {
      bVar1 = false;
      pnVar3 = item;
      if ((url[__n] != '\0') && (url[__n] != ':')) goto LAB_0011c32e;
    }
    else {
LAB_0011c32e:
      bVar1 = true;
      pnVar3 = unaff_R15;
    }
    if (!bVar1) {
      return pnVar3;
    }
    item = (nni_sp_tran *)nni_list_next(&sp_tran_list,item);
    unaff_R15 = pnVar3;
  } while( true );
}

Assistant:

nni_sp_tran *
nni_sp_tran_find(const char *url)
{
	// address is of the form "<scheme>://blah..."
	nni_sp_tran *t;

	NNI_LIST_FOREACH (&sp_tran_list, t) {
		size_t len = strlen(t->tran_scheme);
		if ((strncmp(url, t->tran_scheme, len) == 0) &&
		    (url[len] == ':' || url[len] == '\0')) {
			return (t);
		}
	}
	return (NULL);
}